

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O2

bool rest_mempool(any *context,HTTPRequest *req,string *str_uri_part)

{
  span<const_std::byte,_18446744073709551615UL> reply;
  bool bVar1;
  bool include_mempool_sequence;
  RESTResponseFormat RVar2;
  CTxMemPool *pool;
  string *psVar3;
  string *this;
  long in_FS_OFFSET;
  string raw_mempool_sequence;
  string raw_verbose;
  string str_json;
  string param;
  allocator<char> local_229;
  string local_228;
  UniValue local_208;
  string local_1b0;
  string local_190 [2];
  undefined1 local_150 [32];
  string local_130 [2];
  string local_f0;
  undefined1 local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CheckWarmup(req);
  if (!bVar1) {
    bVar1 = false;
    goto LAB_007ca8bc;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  RVar2 = ParseDataFormat(&local_50,str_uri_part);
  bVar1 = std::operator==(&local_50,"contents");
  if (bVar1) {
LAB_007ca3b7:
    pool = GetMemPool(context,req);
    if (pool == (CTxMemPool *)0x0) goto LAB_007ca674;
    if (RVar2 != JSON) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,"output format not found (available: json)",
                 (allocator<char> *)&local_208);
      RESTERR(req,HTTP_NOT_FOUND,&local_228);
      psVar3 = &local_228;
      goto LAB_007ca66f;
    }
    local_90._0_8_ = local_90 + 0x10;
    local_90._8_8_ = (pointer)0x0;
    local_90[0x10] = '\0';
    bVar1 = std::operator==(&local_50,"contents");
    if (bVar1) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"verbose",(allocator<char> *)local_150);
      HTTPRequest::GetQueryParameter
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208,req,&local_f0);
      std::optional<std::__cxx11::string>::value_or<char_const(&)[5]>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 (optional<std::__cxx11::string> *)&local_208,(char (*) [5])0xe17291);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
      std::__cxx11::string::~string((string *)local_d0);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208);
      std::__cxx11::string::~string((string *)&local_f0);
      bVar1 = std::operator==(&local_b0,"true");
      if (bVar1) {
LAB_007ca4ce:
        local_d0._0_8_ = local_d0 + 0x10;
        local_d0._8_8_ = (pointer)0x0;
        local_d0[0x10] = '\0';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_150,"mempool_sequence",&local_229);
        HTTPRequest::GetQueryParameter
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_208,req,(string *)local_150);
        std::optional<std::__cxx11::string>::value_or<char_const(&)[6]>
                  (&local_f0,(optional<std::__cxx11::string> *)&local_208,(char (*) [6])0xdf9b61);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   &local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_208);
        std::__cxx11::string::~string((string *)local_150);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_d0,"true");
        if (bVar1) {
LAB_007ca592:
          bVar1 = std::operator==(&local_b0,"true");
          include_mempool_sequence =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_d0,"true");
          if (!bVar1 || !include_mempool_sequence) {
            MempoolToJSON(&local_208,pool,bVar1,include_mempool_sequence);
            UniValue::write_abi_cxx11_((UniValue *)local_150,(int)&local_208,(void *)0x0,0);
            std::operator+(&local_f0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_150,"\n");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                      &local_f0);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)local_150);
            UniValue::~UniValue(&local_208);
            std::__cxx11::string::~string((string *)local_d0);
            std::__cxx11::string::~string((string *)&local_b0);
            goto LAB_007ca78d;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1b0,
                     "Verbose results cannot contain mempool sequence values. (hint: set \"verbose=false\")"
                     ,(allocator<char> *)&local_208);
          RESTERR(req,HTTP_BAD_REQUEST,&local_1b0);
          psVar3 = &local_1b0;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0,"false");
          if (bVar1) goto LAB_007ca592;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_190,
                     "The \"mempool_sequence\" query parameter must be either \"true\" or \"false\"."
                     ,(allocator<char> *)&local_208);
          RESTERR(req,HTTP_BAD_REQUEST,local_190);
          psVar3 = local_190;
        }
        std::__cxx11::string::~string((string *)psVar3);
        this = (string *)local_d0;
      }
      else {
        bVar1 = std::operator==(&local_b0,"false");
        if (bVar1) goto LAB_007ca4ce;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_150 + 0x20),
                   "The \"verbose\" query parameter must be either \"true\" or \"false\".",
                   (allocator<char> *)&local_208);
        RESTERR(req,HTTP_BAD_REQUEST,(string *)(local_150 + 0x20));
        this = (string *)(local_150 + 0x20);
      }
      std::__cxx11::string::~string(this);
      std::__cxx11::string::~string((string *)&local_b0);
      bVar1 = false;
    }
    else {
      MempoolInfoToJSON(&local_208,pool);
      UniValue::write_abi_cxx11_((UniValue *)local_d0,(int)&local_208,(void *)0x0,0);
      std::operator+(&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                     "\n");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                 &local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)local_d0);
      UniValue::~UniValue(&local_208);
LAB_007ca78d:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"Content-Type",(allocator<char> *)local_d0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"application/json",(allocator<char> *)&local_f0);
      HTTPRequest::WriteHeader(req,(string *)&local_208,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_208);
      bVar1 = true;
      reply._M_extent._M_extent_value = local_90._8_8_;
      reply._M_ptr = (pointer)local_90._0_8_;
      HTTPRequest::WriteReply(req,200,reply);
    }
    std::__cxx11::string::~string((string *)local_90);
  }
  else {
    bVar1 = std::operator==(&local_50,"info");
    if (bVar1) goto LAB_007ca3b7;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Invalid URI format. Expected /rest/mempool/<info|contents>.json"
               ,(allocator<char> *)&local_208);
    RESTERR(req,HTTP_BAD_REQUEST,&local_70);
    psVar3 = &local_70;
LAB_007ca66f:
    std::__cxx11::string::~string((string *)psVar3);
LAB_007ca674:
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_50);
LAB_007ca8bc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool rest_mempool(const std::any& context, HTTPRequest* req, const std::string& str_uri_part)
{
    if (!CheckWarmup(req))
        return false;

    std::string param;
    const RESTResponseFormat rf = ParseDataFormat(param, str_uri_part);
    if (param != "contents" && param != "info") {
        return RESTERR(req, HTTP_BAD_REQUEST, "Invalid URI format. Expected /rest/mempool/<info|contents>.json");
    }

    const CTxMemPool* mempool = GetMemPool(context, req);
    if (!mempool) return false;

    switch (rf) {
    case RESTResponseFormat::JSON: {
        std::string str_json;
        if (param == "contents") {
            std::string raw_verbose;
            try {
                raw_verbose = req->GetQueryParameter("verbose").value_or("true");
            } catch (const std::runtime_error& e) {
                return RESTERR(req, HTTP_BAD_REQUEST, e.what());
            }
            if (raw_verbose != "true" && raw_verbose != "false") {
                return RESTERR(req, HTTP_BAD_REQUEST, "The \"verbose\" query parameter must be either \"true\" or \"false\".");
            }
            std::string raw_mempool_sequence;
            try {
                raw_mempool_sequence = req->GetQueryParameter("mempool_sequence").value_or("false");
            } catch (const std::runtime_error& e) {
                return RESTERR(req, HTTP_BAD_REQUEST, e.what());
            }
            if (raw_mempool_sequence != "true" && raw_mempool_sequence != "false") {
                return RESTERR(req, HTTP_BAD_REQUEST, "The \"mempool_sequence\" query parameter must be either \"true\" or \"false\".");
            }
            const bool verbose{raw_verbose == "true"};
            const bool mempool_sequence{raw_mempool_sequence == "true"};
            if (verbose && mempool_sequence) {
                return RESTERR(req, HTTP_BAD_REQUEST, "Verbose results cannot contain mempool sequence values. (hint: set \"verbose=false\")");
            }
            str_json = MempoolToJSON(*mempool, verbose, mempool_sequence).write() + "\n";
        } else {
            str_json = MempoolInfoToJSON(*mempool).write() + "\n";
        }

        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, str_json);
        return true;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: json)");
    }
    }
}